

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PieceWiseLinearCalib.cpp
# Opt level: O0

void __thiscall
tactile::PieceWiseLinearCalib::PieceWiseLinearCalib
          (PieceWiseLinearCalib *this,CalibrationMap *values)

{
  CalibrationMap *values_local;
  PieceWiseLinearCalib *this_local;
  
  Calibration::Calibration(&this->super_Calibration);
  (this->super_Calibration)._vptr_Calibration = (_func_int **)&PTR__PieceWiseLinearCalib_00119d20;
  std::map<float,_float,_std::less<float>,_std::allocator<std::pair<const_float,_float>_>_>::map
            (&this->values);
  Range::Range(&this->range,3.4028235e+38,-3.4028235e+38);
  init(this,(EVP_PKEY_CTX *)values);
  return;
}

Assistant:

PieceWiseLinearCalib::PieceWiseLinearCalib(const CalibrationMap &values)
{
	init(values);
}